

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::encode_url(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char hex [4];
  char local_34 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  do {
    bVar1 = (s->_M_dataplus)._M_p[lVar3];
    if (bVar1 < 0x2c) {
      if (0x26 < bVar1) {
        if ((bVar1 == 0x27) || (bVar1 == 0x2b)) goto LAB_0014dbc4;
        goto LAB_0014dbd5;
      }
      if (bVar1 != 0x20) {
        if (bVar1 == 0) {
          return __return_storage_ptr__;
        }
        goto LAB_0014dbd5;
      }
LAB_0014dbc4:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (((bVar1 == 0x2c) || (bVar1 == 0x3a)) || (bVar1 == 0x3b)) goto LAB_0014dbc4;
LAB_0014dbd5:
      if ((char)bVar1 < '\0') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        iVar2 = snprintf(local_34,3,"%02X",(ulong)bVar1);
        if (iVar2 != 2) {
          __assert_fail("len == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                        ,0x3bb,"std::string httplib::detail::encode_url(const std::string &)");
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_34);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

inline std::string encode_url(const std::string& s)
{
    std::string result;

    for (auto i = 0; s[i]; i++) {
        switch (s[i]) {
        case ' ':  result += "%20"; break;
        case '+':  result += "%2B"; break;
        case '\'': result += "%27"; break;
        case ',':  result += "%2C"; break;
        case ':':  result += "%3A"; break;
        case ';':  result += "%3B"; break;
        default:
            auto c = static_cast<uint8_t>(s[i]);
            if (c >= 0x80) {
                result += '%';
                char hex[4];
                size_t len = snprintf(hex, sizeof(hex) - 1, "%02X", c);
                assert(len == 2);
                result.append(hex, len);
            } else {
                result += s[i];
            }
            break;
        }
   }

    return result;
}